

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nh_hall.hpp
# Opt level: O0

void __thiscall
nh_ugens::BaseDelay::BaseDelay(BaseDelay *this,float sample_rate,float max_delay,float delay)

{
  int iVar1;
  int max_delay_in_samples;
  float delay_local;
  float max_delay_local;
  float sample_rate_local;
  BaseDelay *this_local;
  
  this->m_buffer = (float *)0x0;
  this->m_sample_rate = sample_rate;
  iVar1 = next_power_of_two((int)(this->m_sample_rate * max_delay));
  this->m_size = iVar1;
  this->m_mask = this->m_size + -1;
  this->m_read_position = 0;
  this->m_delay = delay;
  this->m_delay_in_samples = (int)(this->m_sample_rate * delay);
  return;
}

Assistant:

BaseDelay(
        float sample_rate,
        float max_delay,
        float delay
    ) :
    m_sample_rate(sample_rate)
    {
        int max_delay_in_samples = m_sample_rate * max_delay;
        m_size = next_power_of_two(max_delay_in_samples);
        m_mask = m_size - 1;

        m_read_position = 0;

        m_delay = delay;
        m_delay_in_samples = m_sample_rate * delay;
    }